

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_last_front_by_stl_str_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void> *this,char *testcase
          ,char *name,size_t index)

{
  TestCase *pTVar1;
  iuFactory<iu_StringSplitLvalue_x_iutest_x_chain_at_last_front_by_stl_str_Test<char32_t>_> *factory
  ;
  
  pTVar1 = AddTestCase(testcase,index);
  (this->m_mediator).super_iuITestCaseMediator.m_test_case = pTVar1;
  (this->m_mediator).super_iuITestCaseMediator._vptr_iuITestCaseMediator =
       (_func_int **)&PTR__iuITestCaseMediator_002aef70;
  TestInfo::TestInfo(&this->m_info,(iuITestCaseMediator *)this,name,
                     &(this->m_factory).super_iuFactoryBase);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_002b2150;
  pTVar1 = TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_last_front_by_stl_str_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
           ::EachTest<iutest::detail::VariadicTypeList<char32_t>,_void>::AddTestCase
                     (testcase,index + 1);
  (this->m_next).m_mediator.super_iuITestCaseMediator.m_test_case = pTVar1;
  (this->m_next).m_mediator.super_iuITestCaseMediator._vptr_iuITestCaseMediator =
       (_func_int **)&PTR__iuITestCaseMediator_002aef70;
  factory = &(this->m_next).m_factory;
  TestInfo::TestInfo(&(this->m_next).m_info,(iuITestCaseMediator *)&this->m_next,name,
                     &factory->super_iuFactoryBase);
  (factory->super_iuFactoryBase)._vptr_iuFactoryBase = (_func_int **)&PTR__iuFactoryBase_002b21e8;
  return;
}

Assistant:

EachTest(const char* testcase, const char* name, size_t index)
            : m_mediator(AddTestCase(testcase, index))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testcase, name, index+1)
        {
        }